

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

int add_tpl_ref_mv(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME ref_frame
                  ,int blk_row,int blk_col,int_mv *gm_mv_candidates,uint8_t *refmv_count,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,int16_t *mode_context)

{
  int iVar1;
  uint num;
  int iVar2;
  RefCntBuffer *pRVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  MV_REFERENCE_FRAME in_R8B;
  int in_R9D;
  int in_stack_00000008;
  short *in_stack_00000010;
  int_mv comp_refmv;
  int cur_offset_1;
  int frame1_index;
  RefCntBuffer *buf_1;
  int_mv this_refmv;
  int force_integer_mv;
  int allow_high_precision_mv;
  int idx;
  int cur_offset_0;
  int frame0_index;
  RefCntBuffer *buf_0;
  int cur_frame_index;
  uint16_t weight_unit;
  MV_REFERENCE_FRAME rf [2];
  TPL_MV_REF *prev_frame_mvs;
  POSITION mi_pos;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int local_78;
  undefined4 local_74;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  MV ref;
  MV_REFERENCE_FRAME local_3a;
  char local_39;
  int *local_38;
  POSITION local_30;
  int local_28;
  MV_REFERENCE_FRAME local_21;
  uint local_20;
  uint local_1c;
  long local_10;
  
  local_78 = in_R9D;
  if ((in_EDX & 1) == 0) {
    local_78 = in_R9D + 1;
  }
  local_30.row = local_78;
  iVar2 = in_stack_00000008;
  if ((in_ECX & 1) == 0) {
    iVar2 = in_stack_00000008 + 1;
  }
  local_30.col = iVar2;
  local_28 = in_R9D;
  local_21 = in_R8B;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  iVar1 = is_inside((TileInfo *)(in_RSI + 0x1ea0),in_ECX,in_EDX,&local_30);
  if (iVar1 == 0) {
    return 0;
  }
  local_38 = (int *)(*(long *)(local_10 + 0x6358) +
                     (long)(((int)(local_1c + local_30.row) >> 1) *
                           (*(int *)(local_10 + 0x244) >> 1)) * 8 +
                    (long)((int)(local_20 + local_30.col) >> 1) * 8);
  if (*local_38 == -0x7fff8000) {
    return 0;
  }
  av1_set_ref_frame(&local_3a,local_21);
  iVar1 = *(int *)(*(long *)(local_10 + 0xe8) + 4);
  pRVar3 = get_ref_frame_buf((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                             (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff7c >> 0x18));
  ref = (MV)pRVar3->order_hint;
  get_relative_dist((OrderHintInfo *)(*(long *)(local_10 + 0x6088) + 0x28),iVar1,(int)ref);
  uVar4 = (uint)(*(byte *)(local_10 + 0x1ed) & 1);
  num = (uint)(*(byte *)(local_10 + 0x1ee) & 1);
  get_mv_projection((MV *)CONCAT44(in_stack_ffffffffffffffac,uVar4),ref,num,
                    in_stack_ffffffffffffffa0);
  lower_mv_precision((MV *)CONCAT44(iVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
  if (local_39 != -1) {
    pRVar3 = get_ref_frame_buf((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                               (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff7c >> 0x18));
    get_relative_dist((OrderHintInfo *)(*(long *)(local_10 + 0x6088) + 0x28),iVar1,
                      pRVar3->order_hint);
    get_mv_projection((MV *)CONCAT44(in_stack_ffffffffffffffac,uVar4),ref,num,
                      in_stack_ffffffffffffffa0);
    lower_mv_precision((MV *)CONCAT44(iVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c,
                       in_stack_ffffffffffffff78);
    if ((local_28 == 0) && (in_stack_00000008 == 0)) {
      iVar2 = (int)(short)in_stack_ffffffffffffffa0 - (int)*in_stack_00000010;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 0x10) {
        iVar2 = (int)(short)(in_stack_ffffffffffffffa0 >> 0x10) - (int)in_stack_00000010[1];
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        if (iVar2 < 0x10) {
          iVar2 = (int)(short)local_74 - (int)in_stack_00000010[2];
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if (iVar2 < 0x10) {
            iVar2 = (int)local_74._2_2_ - (int)in_stack_00000010[3];
            if (iVar2 < 1) {
              iVar2 = -iVar2;
            }
            if (iVar2 < 0x10) goto LAB_006d684a;
          }
        }
      }
      *(ushort *)(_allow_high_precision_mv + (long)local_21 * 2) =
           *(ushort *)(_allow_high_precision_mv + (long)local_21 * 2) | 8;
    }
LAB_006d684a:
    uVar4 = 0;
    while (((int)uVar4 < (int)(uint)*_cur_offset_1 &&
           ((in_stack_ffffffffffffffa0 != buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -2] ||
            (local_74 != buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -1]))))) {
      uVar4 = uVar4 + 1;
    }
    if ((int)uVar4 < (int)(uint)*_cur_offset_1) {
      *(short *)(_this_refmv + (long)(int)uVar4 * 2) =
           *(short *)(_this_refmv + (long)(int)uVar4 * 2) + 2;
    }
    if (uVar4 != *_cur_offset_1) {
      return 1;
    }
    if (7 < *_cur_offset_1) {
      return 1;
    }
    buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -2] = in_stack_ffffffffffffffa0;
    buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -1] = local_74;
    *(undefined2 *)(_this_refmv + (long)(int)uVar4 * 2) = 2;
    *_cur_offset_1 = *_cur_offset_1 + 1;
    return 1;
  }
  if ((local_28 == 0) && (in_stack_00000008 == 0)) {
    iVar2 = (int)(short)in_stack_ffffffffffffffa0 - (int)*in_stack_00000010;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < 0x10) {
      iVar2 = (int)(short)(in_stack_ffffffffffffffa0 >> 0x10) - (int)in_stack_00000010[1];
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 0x10) goto LAB_006d665f;
    }
    *(ushort *)(_allow_high_precision_mv + (long)local_21 * 2) =
         *(ushort *)(_allow_high_precision_mv + (long)local_21 * 2) | 8;
  }
LAB_006d665f:
  uVar4 = 0;
  while (((int)uVar4 < (int)(uint)*_cur_offset_1 &&
         (in_stack_ffffffffffffffa0 != buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -2]))) {
    uVar4 = uVar4 + 1;
  }
  if ((int)uVar4 < (int)(uint)*_cur_offset_1) {
    *(short *)(_this_refmv + (long)(int)uVar4 * 2) =
         *(short *)(_this_refmv + (long)(int)uVar4 * 2) + 2;
  }
  if ((uVar4 == *_cur_offset_1) && (*_cur_offset_1 < 8)) {
    buf_1->ref_order_hints[(long)(int)uVar4 * 2 + -2] = in_stack_ffffffffffffffa0;
    *(undefined2 *)(_this_refmv + (long)(int)uVar4 * 2) = 2;
    *_cur_offset_1 = *_cur_offset_1 + 1;
  }
  return 1;
}

Assistant:

static int add_tpl_ref_mv(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                          int mi_row, int mi_col, MV_REFERENCE_FRAME ref_frame,
                          int blk_row, int blk_col, int_mv *gm_mv_candidates,
                          uint8_t *const refmv_count,
                          CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
                          uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE],
                          int16_t *mode_context) {
  POSITION mi_pos;
  mi_pos.row = (mi_row & 0x01) ? blk_row : blk_row + 1;
  mi_pos.col = (mi_col & 0x01) ? blk_col : blk_col + 1;

  if (!is_inside(&xd->tile, mi_col, mi_row, &mi_pos)) return 0;

  const TPL_MV_REF *prev_frame_mvs =
      cm->tpl_mvs +
      ((mi_row + mi_pos.row) >> 1) * (cm->mi_params.mi_stride >> 1) +
      ((mi_col + mi_pos.col) >> 1);
  if (prev_frame_mvs->mfmv0.as_int == INVALID_MV) return 0;

  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  const uint16_t weight_unit = 1;  // mi_size_wide[BLOCK_8X8];
  const int cur_frame_index = cm->cur_frame->order_hint;
  const RefCntBuffer *const buf_0 = get_ref_frame_buf(cm, rf[0]);
  const int frame0_index = buf_0->order_hint;
  const int cur_offset_0 = get_relative_dist(&cm->seq_params->order_hint_info,
                                             cur_frame_index, frame0_index);
  int idx;
  const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
  const int force_integer_mv = cm->features.cur_frame_force_integer_mv;

  int_mv this_refmv;
  get_mv_projection(&this_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                    cur_offset_0, prev_frame_mvs->ref_frame_offset);
  lower_mv_precision(&this_refmv.as_mv, allow_high_precision_mv,
                     force_integer_mv);

  if (rf[1] == NONE_FRAME) {
    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx)
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int) break;

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  } else {
    // Process compound inter mode
    const RefCntBuffer *const buf_1 = get_ref_frame_buf(cm, rf[1]);
    const int frame1_index = buf_1->order_hint;
    const int cur_offset_1 = get_relative_dist(&cm->seq_params->order_hint_info,
                                               cur_frame_index, frame1_index);
    int_mv comp_refmv;
    get_mv_projection(&comp_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                      cur_offset_1, prev_frame_mvs->ref_frame_offset);
    lower_mv_precision(&comp_refmv.as_mv, allow_high_precision_mv,
                       force_integer_mv);

    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16 ||
          abs(comp_refmv.as_mv.row - gm_mv_candidates[1].as_mv.row) >= 16 ||
          abs(comp_refmv.as_mv.col - gm_mv_candidates[1].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx) {
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int &&
          comp_refmv.as_int == ref_mv_stack[idx].comp_mv.as_int)
        break;
    }

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_stack[idx].comp_mv.as_int = comp_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  }

  return 1;
}